

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

char * ly_strvecode(LY_VECODE vecode)

{
  char *pcStack_10;
  LY_VECODE vecode_local;
  
  switch(vecode) {
  case LYVE_SUCCESS:
    pcStack_10 = "Success";
    break;
  case LYVE_SYNTAX:
    pcStack_10 = "General syntax error";
    break;
  case LYVE_SYNTAX_YANG:
    pcStack_10 = "YANG syntax error";
    break;
  case LYVE_SYNTAX_YIN:
    pcStack_10 = "YIN syntax error";
    break;
  case LYVE_REFERENCE:
    pcStack_10 = "Reference error";
    break;
  case LYVE_XPATH:
    pcStack_10 = "XPath error";
    break;
  case LYVE_SEMANTICS:
    pcStack_10 = "Semantic error";
    break;
  case LYVE_SYNTAX_XML:
    pcStack_10 = "XML syntax error";
    break;
  case LYVE_SYNTAX_JSON:
    pcStack_10 = "JSON syntax error";
    break;
  case LYVE_DATA:
    pcStack_10 = "YANG data error";
    break;
  case LYVE_OTHER:
    pcStack_10 = "Another error";
    break;
  default:
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

LIBYANG_API_DEF const char *
ly_strvecode(LY_VECODE vecode)
{
    switch (vecode) {
    case LYVE_SUCCESS:
        return "Success";
    case LYVE_SYNTAX:
        return "General syntax error";
    case LYVE_SYNTAX_YANG:
        return "YANG syntax error";
    case LYVE_SYNTAX_YIN:
        return "YIN syntax error";
    case LYVE_REFERENCE:
        return "Reference error";
    case LYVE_XPATH:
        return "XPath error";
    case LYVE_SEMANTICS:
        return "Semantic error";
    case LYVE_SYNTAX_XML:
        return "XML syntax error";
    case LYVE_SYNTAX_JSON:
        return "JSON syntax error";
    case LYVE_DATA:
        return "YANG data error";
    case LYVE_OTHER:
        return "Another error";
    }

    /* unreachable */
    return "Unknown";
}